

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::InitializeAllocations(ScriptContext *this)

{
  ArenaAllocator *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CharClassifier *this_01;
  InlineCache *pIVar4;
  undefined4 *puVar5;
  uint *puVar6;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar7;
  StringProfiler *this_02;
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar8;
  HeapAllocator *alloc;
  DebugContext *this_03;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  this_00 = &this->generalAllocator;
  this_01 = (CharClassifier *)new<Memory::ArenaAllocator>(0x48,this_00,0x366bee);
  CharClassifier::CharClassifier(this_01);
  this->charClassifier = this_01;
  pIVar4 = (InlineCache *)
           new<Memory::InlineCacheAllocator>(0x20,&this->inlineCacheAllocator,0x782450);
  this->valueOfInlineCache = pIVar4;
  pIVar4 = (InlineCache *)
           new<Memory::InlineCacheAllocator>(0x20,&this->inlineCacheAllocator,0x782450);
  this->toStringInlineCache = pIVar4;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_0078eab7;
    *puVar5 = 0;
  }
  puVar6 = (uint *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(&this_00->
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 ,0xb4);
  memset(puVar6,0,0xb4);
  data.line = 0xc3;
  data._36_4_ = 0;
  memset(puVar6 + 0x2d,0,0xc);
  if (puVar6 == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) goto LAB_0078eab7;
    *puVar5 = 0;
  }
  this->rejitReasonCounts = puVar6;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_0078eab7;
    *puVar5 = 0;
  }
  puVar6 = (uint *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(&this_00->
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 ,0xb4);
  memset(puVar6,0,0xb4);
  memset(puVar6 + 0x2d,0,(data._32_8_ & 0x7fffffff0) - 0xb4);
  if (puVar6 == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_0078eab7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  this->rejitReasonCountsCap = puVar6;
  pBVar7 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,this_00,0x366bee);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar7,this_00,0);
  this->bailoutReasonCounts = pBVar7;
  pBVar7 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,this_00,0x366bee);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar7,this_00,0);
  this->bailoutReasonCountsCap = pBVar7;
  if (DAT_015c7940 == '\x01') {
    this_02 = (StringProfiler *)new<Memory::ArenaAllocator>(0x110,&this->miscAllocator,0x366bee);
    StringProfiler::StringProfiler
              (this_02,&(this->threadContext->pageAllocator).super_PageAllocator);
    this->stringProfiler = this_02;
  }
  pBVar8 = (BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,this_00,0x366bee);
  JsUtil::
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar8,this_00,0);
  this->intConstPropsOnGlobalObject = (PropIdSetForConstProp *)pBVar8;
  pBVar8 = (BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,this_00,0x366bee);
  JsUtil::
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar8,this_00,0);
  this->intConstPropsOnGlobalUserObject = (PropIdSetForConstProp *)pBVar8;
  local_68 = (undefined1  [8])&DebugContext::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2d86450;
  data.filename._0_4_ = 0x171;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_68);
  this_03 = (DebugContext *)new<Memory::HeapAllocator>(0x20,alloc,0x300d4a);
  DebugContext::DebugContext(this_03,this);
  this->debugContext = this_03;
  return;
}

Assistant:

void ScriptContext::InitializeAllocations()
    {
        this->charClassifier = Anew(GeneralAllocator(), CharClassifier);

        this->valueOfInlineCache = AllocatorNewZ(InlineCacheAllocator, GetInlineCacheAllocator(), InlineCache);
        this->toStringInlineCache = AllocatorNewZ(InlineCacheAllocator, GetInlineCacheAllocator(), InlineCache);

#ifdef REJIT_STATS
        rejitReasonCounts = AnewArrayZ(GeneralAllocator(), uint, NumRejitReasons);
        rejitReasonCountsCap = AnewArrayZ(GeneralAllocator(), uint, NumRejitReasons);
        bailoutReasonCounts = Anew(GeneralAllocator(), BailoutStatsMap, GeneralAllocator());
        bailoutReasonCountsCap = Anew(GeneralAllocator(), BailoutStatsMap, GeneralAllocator());
#endif

#ifdef ENABLE_BASIC_TELEMETRY
        // TODO - allocate this on the Heap instead of using a custom allocator?
        this->telemetry = Anew(this->TelemetryAllocator(), Js::ScriptContextTelemetry, this);
#endif

#ifdef PROFILE_STRINGS
        if (Js::Configuration::Global.flags.ProfileStrings)
        {
            stringProfiler = Anew(MiscAllocator(), StringProfiler, threadContext->GetPageAllocator());
        }
#endif
        intConstPropsOnGlobalObject = Anew(GeneralAllocator(), PropIdSetForConstProp, GeneralAllocator());
        intConstPropsOnGlobalUserObject = Anew(GeneralAllocator(), PropIdSetForConstProp, GeneralAllocator());

#ifdef ENABLE_SCRIPT_DEBUGGING
        this->debugContext = HeapNew(DebugContext, this);
#endif
    }